

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

ImageChannelValues * __thiscall pbrt::Image::Average(Image *this,ImageChannelDesc *desc)

{
  Point2i PVar1;
  size_t sVar2;
  reference pvVar3;
  reference pvVar4;
  Tuple2<pbrt::Point2,_int> in_RDX;
  Image *in_RSI;
  ImageChannelValues *in_RDI;
  float fVar5;
  int c_1;
  int c;
  ImageChannelValues v;
  int x;
  int y;
  vector<double,_std::allocator<double>_> sum;
  ImageChannelValues *average;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  allocator_type *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  Float in_stack_fffffffffffffe94;
  size_type in_stack_fffffffffffffe98;
  ImageChannelValues *in_stack_fffffffffffffea0;
  value_type vVar6;
  int iStack_c0;
  Float local_bc;
  int local_b4;
  int local_ac;
  int local_64;
  int local_5c;
  int iStack_54;
  int local_50;
  ImageChannelDesc *in_stack_ffffffffffffffd0;
  Image *in_stack_ffffffffffffffd8;
  array<pbrt::WrapMode,_2> in_stack_ffffffffffffffe0;
  
  ImageChannelDesc::size((ImageChannelDesc *)0x4c174f);
  std::allocator<double>::allocator((allocator<double> *)0x4c1778);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98,
             (value_type_conflict4 *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88);
  std::allocator<double>::~allocator((allocator<double> *)0x4c17ac);
  local_50 = 0;
  local_bc = in_stack_fffffffffffffe94;
  while( true ) {
    PVar1 = Resolution(in_RSI);
    iStack_54 = PVar1.super_Tuple2<pbrt::Point2,_int>.y;
    if (iStack_54 <= local_50) break;
    local_5c = 0;
    while( true ) {
      PVar1 = Resolution(in_RSI);
      local_64 = PVar1.super_Tuple2<pbrt::Point2,_int>.x;
      if (local_64 <= local_5c) break;
      Point2<int>::Point2((Point2<int> *)
                          CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                          in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      WrapMode2D::WrapMode2D
                ((WrapMode2D *)CONCAT44(local_bc,in_stack_fffffffffffffe90),
                 (WrapMode)((ulong)in_stack_fffffffffffffe88 >> 0x20));
      GetChannels(in_stack_ffffffffffffffd8,(Point2i)in_RDX,in_stack_ffffffffffffffd0,
                  (WrapMode2D)in_stack_ffffffffffffffe0.values);
      for (local_ac = 0; sVar2 = ImageChannelDesc::size((ImageChannelDesc *)0x4c18dd),
          (ulong)(long)local_ac < sVar2; local_ac = local_ac + 1) {
        pvVar3 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                           ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                            CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        fVar5 = *pvVar3;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd0,
                            (long)local_ac);
        *pvVar4 = (double)fVar5 + *pvVar4;
      }
      ImageChannelValues::~ImageChannelValues((ImageChannelValues *)0x4c19d1);
      local_5c = local_5c + 1;
    }
    local_50 = local_50 + 1;
  }
  ImageChannelDesc::size((ImageChannelDesc *)0x4c1a14);
  ImageChannelValues::ImageChannelValues
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,local_bc);
  for (local_b4 = 0; sVar2 = ImageChannelDesc::size((ImageChannelDesc *)0x4c1a58),
      (ulong)(long)local_b4 < sVar2; local_b4 = local_b4 + 1) {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffffd0,
                        (long)local_b4);
    vVar6 = *pvVar4;
    PVar1 = Resolution(in_RSI);
    local_bc = (Float)PVar1.super_Tuple2<pbrt::Point2,_int>.x;
    PVar1 = Resolution(in_RSI);
    iStack_c0 = PVar1.super_Tuple2<pbrt::Point2,_int>.y;
    fVar5 = (float)(vVar6 / (double)((int)local_bc * iStack_c0));
    pvVar3 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                        CONCAT44(fVar5,in_stack_fffffffffffffe80),
                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    *pvVar3 = fVar5;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(local_bc,in_stack_fffffffffffffe90)
            );
  return in_RDI;
}

Assistant:

ImageChannelValues Image::Average(const ImageChannelDesc &desc) const {
    std::vector<double> sum(desc.size(), 0.);

    for (int y = 0; y < Resolution().y; ++y)
        for (int x = 0; x < Resolution().x; ++x) {
            ImageChannelValues v = GetChannels({x, y}, desc);
            for (int c = 0; c < desc.size(); ++c)
                sum[c] += v[c];
        }

    ImageChannelValues average(desc.size());
    for (int c = 0; c < desc.size(); ++c)
        average[c] = sum[c] / (Resolution().x * Resolution().y);
    return average;
}